

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::DataCompare<unsigned_int>
          (DrawIndirectBase *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *dataRef,
          uint widthRef,uint heightRef,vector<unsigned_int,_std::allocator<unsigned_int>_> *dataTest
          ,uint widthTest,uint heightTest,uint offsetYRef,uint offsetYTest)

{
  _func_int **pp_Var1;
  ulong uVar2;
  runtime_error *this_00;
  undefined4 in_register_0000000c;
  long *plVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint local_33c;
  DILogger local_338;
  DIResult status;
  
  uVar6 = (uint)dataTest;
  plVar3 = (long *)CONCAT44(in_register_0000000c,heightRef);
  uVar5 = (uint)dataRef;
  pp_Var1 = (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper;
  if ((ulong)((long)(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl -
              (long)pp_Var1 >> 2) < (ulong)(widthRef * uVar5)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid reference buffer resolution!");
  }
  else {
    if ((ulong)(widthTest * uVar6) <= (ulong)(plVar3[1] - *plVar3 >> 2)) {
      uVar8 = (ulong)dataRef & 0xffffffff;
      if (uVar6 < uVar5) {
        uVar8 = (ulong)dataTest & 0xffffffff;
      }
      uVar2 = (ulong)widthRef;
      if (widthTest < widthRef) {
        uVar2 = (ulong)widthTest;
      }
      uVar7 = offsetYRef * uVar6;
      uVar9 = heightTest * uVar5;
      uVar12 = 0;
      do {
        if (uVar12 == uVar2) {
          return 0;
        }
        lVar11 = (ulong)uVar7 * -4;
        lVar4 = (ulong)uVar9 * -4;
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          if (*(int *)((long)pp_Var1 + uVar10 * 4 + (ulong)uVar9 * 4) !=
              *(int *)(*plVar3 + (ulong)uVar7 * 4 + uVar10 * 4)) {
            DIResult::DIResult(&status);
            DIResult::error(&local_338,&status);
            if (local_338.null_log_ == false) {
              std::operator<<(&local_338.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                              "Compare failed: different values [x: ");
            }
            if ((local_338.null_log_ & 1U) == 0) {
              std::ostream::_M_insert<unsigned_long>((ulong)&local_338.str_);
            }
            if ((local_338.null_log_ & 1U) == 0) {
              std::operator<<(&local_338.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                              ", y: ");
            }
            local_33c = offsetYRef + (int)uVar12;
            glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,&local_33c);
            if (local_338.null_log_ == false) {
              std::operator<<(&local_338.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                              ", reference: ");
            }
            glcts::(anonymous_namespace)::DILogger::operator<<
                      ((DILogger *)&local_338,
                       (uint *)((long)(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper -
                               lVar4));
            glcts::(anonymous_namespace)::DILogger::operator<<
                      ((DILogger *)&local_338,(char (*) [9])", test: ");
            glcts::(anonymous_namespace)::DILogger::operator<<
                      ((DILogger *)&local_338,(uint *)(*plVar3 - lVar11));
            glcts::(anonymous_namespace)::DILogger::operator<<
                      ((DILogger *)&local_338,(char (*) [2])0x167c63a);
            DILogger::~DILogger(&local_338);
            DILogger::~DILogger(&status.logger_);
            return status.status_;
          }
          lVar11 = lVar11 + -4;
          lVar4 = lVar4 + -4;
        }
        uVar12 = uVar12 + 1;
        uVar7 = uVar7 + uVar6;
        uVar9 = uVar9 + uVar5;
      } while( true );
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid test buffer resolution!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

long DataCompare(const std::vector<T>& dataRef, unsigned int widthRef, unsigned int heightRef,
					 const std::vector<T>& dataTest, unsigned int widthTest, unsigned int heightTest,
					 unsigned offsetYRef = 0, unsigned offsetYTest = 0)
	{
		if (widthRef * heightRef > dataRef.size())
			throw std::runtime_error("Invalid reference buffer resolution!");

		if (widthTest * heightTest > dataTest.size())
			throw std::runtime_error("Invalid test buffer resolution!");

		unsigned int width  = std::min(widthRef, widthTest);
		unsigned int height = std::min(heightRef, heightTest);

		for (unsigned int i = 0; i < height; ++i)
		{
			unsigned int offsetRef  = (i + offsetYRef) * widthRef;
			unsigned int offsetTest = (i + offsetYTest) * widthTest;

			for (size_t j = 0; j < width; ++j)
			{
				if (dataRef[offsetRef + j] != dataTest[offsetTest + j])
				{
					DIResult status;
					status.error() << "Compare failed: different values [x: " << j << ", y: " << i + offsetYTest
								   << ", reference: " << dataRef[offsetRef + j]
								   << ", test: " << dataTest[offsetTest + j] << "]";
					return status.code();
				}
			}
		}

		return NO_ERROR;
	}